

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

string * __thiscall
Json::Value::toStyledString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  StyledWriter writer;
  StyledWriter local_78;
  
  local_78.document_._M_dataplus._M_p = (pointer)&local_78.document_.field_2;
  local_78.super_Writer._vptr_Writer = (_func_int **)&PTR__StyledWriter_00121d20;
  local_78.childValues_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.childValues_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.childValues_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.document_._M_string_length = 0;
  local_78.document_.field_2._M_local_buf[0] = '\0';
  local_78.indentString_._M_dataplus._M_p = (pointer)&local_78.indentString_.field_2;
  local_78.indentString_._M_string_length = 0;
  local_78.indentString_.field_2._M_local_buf[0] = '\0';
  local_78.rightMargin_ = 0x4a;
  local_78.indentSize_ = 3;
  local_78.addChildValues_ = false;
  StyledWriter::write_abi_cxx11_
            ((StyledWriter *)__return_storage_ptr__,(int)&local_78,this,
             (size_t)local_78.indentString_._M_dataplus._M_p);
  StyledWriter::~StyledWriter(&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string Value::toStyledString() const {
  StyledWriter writer;
  return writer.write(*this);
}